

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

void handle_level_stairs(chunk_conflict *c,_Bool persistent,wchar_t down_count,wchar_t up_count)

{
  chunk_conflict *pcVar1;
  int iVar2;
  int local_2c;
  wchar_t local_28;
  int local_24;
  wchar_t minsep;
  wchar_t up_count_local;
  wchar_t down_count_local;
  _Bool persistent_local;
  chunk_conflict *c_local;
  
  if (c->height < c->width) {
    local_24 = c->height;
  }
  else {
    local_24 = c->width;
  }
  iVar2 = 0;
  if (persistent) {
    iVar2 = 4;
  }
  if (local_24 / 4 < iVar2) {
    local_28 = L'\0';
    if (persistent) {
      local_28 = L'\x04';
    }
  }
  else {
    if (c->height < c->width) {
      local_2c = c->height;
    }
    else {
      local_2c = c->width;
    }
    local_28 = local_2c / 4;
  }
  if ((!persistent) ||
     (pcVar1 = chunk_find_adjacent(c->depth,"down"), pcVar1 == (chunk_conflict *)0x0)) {
    alloc_stairs(c,FEAT_MORE,down_count,local_28,false,dun->one_off_below);
  }
  if ((!persistent) ||
     (pcVar1 = chunk_find_adjacent(c->depth,"up"), pcVar1 == (chunk_conflict *)0x0)) {
    alloc_stairs(c,FEAT_LESS,up_count,local_28,false,dun->one_off_above);
  }
  return;
}

Assistant:

static void handle_level_stairs(struct chunk *c, bool persistent,
		int down_count, int up_count)
{
	/*
	 * For persistent levels, require that the stairs be at least four
	 * grids apart (two for surrounding walls; two for a buffer between
	 * the walls; the buffer space could be one - shared by the
	 * staircases - but the reservations in the room map don't allow for
	 * that) so the staircase rooms in the connecting level won't overlap.
	 * For both the persistent and non-persistent case, also require that
	 * the stairs be at least 1/4th of the level's diameter (PowerDiver's
	 * suggestion) apart to prevent them from all appearing in certain
	 * rooms.
	 */
	int minsep = MAX(MIN(c->width, c->height) / 4, (persistent) ? 4 : 0);

	if (!persistent || !chunk_find_adjacent(c->depth, "down")) {
		alloc_stairs(c, FEAT_MORE, down_count, minsep, false,
			dun->one_off_below);
	}
	if (!persistent || !chunk_find_adjacent(c->depth, "up")) {
		alloc_stairs(c, FEAT_LESS, up_count, minsep, false,
			dun->one_off_above);
	}
}